

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall
StatisticsWriter::writeData
          (StatisticsWriter *this,ostream *stream,DataVector *data,string *delimiter)

{
  char cVar1;
  pointer pDVar2;
  ostream *this_00;
  pointer pDVar3;
  
  pDVar3 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
           super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pDVar2 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
           super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (pDVar3 != pDVar2) {
    do {
      if (pDVar3->active != false) {
        std::ostream::_M_insert<double>((ostream *)stream,pDVar3->value);
        if (pDVar3 + 1 ==
            (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
            super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)stream,(delimiter->_M_dataplus)._M_p,delimiter->_M_string_length);
        pDVar2 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                 super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      pDVar3 = pDVar3 + 1;
    } while (pDVar3 != pDVar2);
  }
  cVar1 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
  this_00 = (ostream *)std::ostream::put((ostream *)stream,cVar1);
  std::ostream::flush(this_00);
  return;
}

Assistant:

void
    writeData(std::ostream & stream,
              DataVector const & data,
              std::string const delimiter = " ")
    {

        for (DataVector::const_iterator it = data.begin(); it != data.end();)
        {
            // Skip inactive data
            if (!it->active)
            {
                ++it;
                continue;
            }

            // Write out data
            stream << it->value;
            ++it;

            // Write out delimiter if not last entry
            if (it != data.end())
            {
                stream << delimiter;
            }
        }
        stream << std::endl;

    }